

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::MergeFrom
          (NeuralNetworkPreprocessing *this,NeuralNetworkPreprocessing *from)

{
  void *pvVar1;
  string *initial_value;
  string *psVar2;
  LogMessage *other;
  NeuralNetworkImageScaler *this_00;
  NeuralNetworkMeanImage *this_01;
  NeuralNetworkImageScaler *from_00;
  NeuralNetworkMeanImage *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xc5a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  initial_value = (from->featurename_).ptr_;
  if ((initial_value->_M_string_length != 0) &&
     (psVar2 = (this->featurename_).ptr_, psVar2 != initial_value)) {
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->featurename_,initial_value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  if (from->_oneof_case_[0] != 0xb) {
    if (from->_oneof_case_[0] != 10) {
      return;
    }
    if (this->_oneof_case_[0] == 10) {
      this_00 = (this->preprocessor_).scaler_;
    }
    else {
      clear_preprocessor(this);
      this->_oneof_case_[0] = 10;
      this_00 = (NeuralNetworkImageScaler *)operator_new(0x28);
      NeuralNetworkImageScaler::NeuralNetworkImageScaler(this_00);
      (this->preprocessor_).scaler_ = this_00;
      if (from->_oneof_case_[0] != 10) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (NeuralNetworkImageScaler *)&_NeuralNetworkImageScaler_default_instance_;
        goto LAB_001e2d79;
      }
    }
    from_00 = (from->preprocessor_).scaler_;
LAB_001e2d79:
    NeuralNetworkImageScaler::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 0xb) {
    this_01 = (this->preprocessor_).meanimage_;
  }
  else {
    clear_preprocessor(this);
    this->_oneof_case_[0] = 0xb;
    this_01 = (NeuralNetworkMeanImage *)operator_new(0x28);
    NeuralNetworkMeanImage::NeuralNetworkMeanImage(this_01);
    (this->preprocessor_).meanimage_ = this_01;
    if (from->_oneof_case_[0] != 0xb) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (NeuralNetworkMeanImage *)&_NeuralNetworkMeanImage_default_instance_;
      goto LAB_001e2d8f;
    }
  }
  from_01 = (from->preprocessor_).meanimage_;
LAB_001e2d8f:
  NeuralNetworkMeanImage::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void NeuralNetworkPreprocessing::MergeFrom(const NeuralNetworkPreprocessing& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkPreprocessing)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.featurename().size() > 0) {

    featurename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.featurename_);
  }
  switch (from.preprocessor_case()) {
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::NeuralNetworkImageScaler::MergeFrom(from.scaler());
      break;
    }
    case kMeanImage: {
      mutable_meanimage()->::CoreML::Specification::NeuralNetworkMeanImage::MergeFrom(from.meanimage());
      break;
    }
    case PREPROCESSOR_NOT_SET: {
      break;
    }
  }
}